

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall
ON_BinaryArchive::ReadArray(ON_BinaryArchive *this,ON_SimpleArray<ON_UUID_struct> *a)

{
  bool local_41;
  bool local_31;
  ON__INT32 local_30;
  int iStack_2c;
  bool rc;
  int count;
  int i;
  ON_UUID uuid;
  ON_SimpleArray<ON_UUID_struct> *a_local;
  ON_BinaryArchive *this_local;
  
  uuid.Data4 = (uchar  [8])a;
  ON_SimpleArray<ON_UUID_struct>::Empty(a);
  local_30 = 0;
  local_31 = ReadInt(this,&local_30);
  if ((local_31) && (0 < local_30)) {
    ON_SimpleArray<ON_UUID_struct>::SetCapacity
              ((ON_SimpleArray<ON_UUID_struct> *)uuid.Data4,(long)local_30);
    iStack_2c = 0;
    while( true ) {
      local_41 = false;
      if (iStack_2c < local_30) {
        local_41 = local_31;
      }
      if (local_41 == false) break;
      local_31 = ReadUuid(this,(ON_UUID *)&count);
      if (local_31) {
        ON_SimpleArray<ON_UUID_struct>::Append
                  ((ON_SimpleArray<ON_UUID_struct> *)uuid.Data4,(ON_UUID_struct *)&count);
      }
      iStack_2c = iStack_2c + 1;
    }
  }
  return local_31;
}

Assistant:

bool
ON_BinaryArchive::ReadArray( ON_SimpleArray<ON_UUID>& a )
{
  a.Empty();
  ON_UUID uuid;
  int i, count = 0;
  bool rc = ReadInt( &count );
  if ( rc && count > 0 ) 
  {
    a.SetCapacity( count );
    for ( i = 0; i < count && rc; i++ )
    {
      rc = ReadUuid( uuid );
      if ( rc )
        a.Append(uuid);
    }
  }
  return rc;
}